

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.c
# Opt level: O2

void BrotliCompressFragmentTwoPassImpl13
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,uint32_t *command_buf,
               uint8_t *literal_buf,int *table,size_t *storage_ix,uint8_t *storage)

{
  long *plVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint8_t *puVar5;
  byte bVar6;
  uint uVar7;
  undefined4 in_register_0000000c;
  uint32_t *commands;
  long *plVar8;
  ulong uVar9;
  int *piVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  size_t input_size_00;
  long *input_00;
  long *__src;
  long *__src_00;
  char *pcVar15;
  uint uVar16;
  long *plVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint8_t *puVar22;
  long *plVar23;
  int iVar24;
  uint32_t *puVar25;
  bool bVar26;
  long lStackY_a0;
  uint32_t *local_90;
  
  commands = (uint32_t *)CONCAT44(in_register_0000000c,is_last);
  input_00 = (long *)input;
  while( true ) {
    if (input_size == 0) {
      return;
    }
    input_size_00 = 0x20000;
    if (input_size < 0x20000) {
      input_size_00 = input_size;
    }
    plVar1 = (long *)((long)input_00 + input_size_00);
    __src = input_00;
    puVar25 = commands;
    local_90 = command_buf;
    if (0xf < input_size) break;
LAB_00125ed7:
    if (__src < plVar1) {
      uVar7 = (uint)((long)plVar1 - (long)__src);
      if (5 < uVar7) {
        if (uVar7 < 0x82) {
          uVar7 = uVar7 - 2;
          uVar3 = 0x1f;
          if (uVar7 != 0) {
            for (; uVar7 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          bVar6 = (char)(uVar3 ^ 0xffffffe0) + 0x1f;
          uVar4 = uVar7 >> (bVar6 & 0x1f);
          uVar7 = (uVar7 - (uVar4 << (bVar6 & 0x1f))) * 0x100 |
                  uVar4 + (uVar3 ^ 0xffffffe0) * 2 + 0x40;
        }
        else if (uVar7 < 0x842) {
          uVar3 = 0x1f;
          if (uVar7 - 0x42 != 0) {
            for (; uVar7 - 0x42 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          uVar7 = (((-1 << ((byte)uVar3 & 0x1f)) + uVar7 + -0x42) * 0x100 - (uVar3 ^ 0x1f)) + 0x29;
        }
        else {
          iVar12 = uVar7 * 0x100;
          if (uVar7 < 0x1842) {
            uVar7 = iVar12 - 0x841eb;
          }
          else if (uVar7 < 0x5842) {
            uVar7 = iVar12 - 0x1841ea;
          }
          else {
            uVar7 = iVar12 - 0x5841e9;
          }
        }
      }
      *puVar25 = uVar7;
      puVar25 = puVar25 + 1;
      uVar14 = (long)plVar1 - (long)__src & 0xffffffff;
      memcpy(local_90,__src,uVar14);
      local_90 = (uint32_t *)((long)local_90 + uVar14);
    }
    iVar12 = ShouldCompress((uint8_t *)input_00,input_size_00,(long)local_90 - (long)command_buf);
    if (iVar12 == 0) {
      EmitUncompressedMetaBlock
                ((uint8_t *)input_00,input_size_00,(size_t *)table,(uint8_t *)storage_ix);
    }
    else {
      BrotliStoreMetaBlockHeader(input_size_00,0,(size_t *)table,(uint8_t *)storage_ix);
      uVar14 = *(ulong *)table;
      uVar9 = uVar14 >> 3;
      *(ulong *)((long)storage_ix + uVar9) = (ulong)*(byte *)((long)storage_ix + uVar9);
      *(ulong *)table = uVar14 + 0xd;
      StoreCommands(m,(uint8_t *)command_buf,(long)local_90 - (long)command_buf,commands,
                    (long)puVar25 - (long)commands >> 2,(size_t *)table,(uint8_t *)storage_ix);
    }
    input_size = input_size - input_size_00;
    input_00 = plVar1;
  }
  uVar14 = input_size - 0x10;
  if (input_size_00 - 4 < input_size - 0x10) {
    uVar14 = input_size_00 - 4;
  }
  plVar8 = (long *)(uVar14 + (long)input_00);
  uVar14 = 0xffffffffffffffff;
  __src_00 = input_00;
LAB_00125997:
  lVar13 = *(long *)((long)__src_00 + 1);
  iVar12 = (int)uVar14;
  uVar9 = 0x20;
  plVar23 = (long *)((long)__src_00 + 1);
  do {
    plVar17 = (long *)((uVar9 >> 5) + (long)plVar23);
    __src = __src_00;
    if (plVar8 < plVar17) goto LAB_00125ed7;
    uVar18 = (ulong)(lVar13 * 0x1e35a7bd00000000) >> 0x33;
    lVar13 = *plVar17;
    iVar11 = (int)plVar23;
    iVar24 = (int)input;
    if (((int)*plVar23 == *(int *)((long)plVar23 + -(long)iVar12)) && (0 < iVar12)) {
      puVar5 = (uint8_t *)((long)plVar23 + -(long)iVar12);
      *(int *)(literal_buf + uVar18 * 4) = iVar11 - iVar24;
LAB_00125a05:
      uVar18 = (long)plVar23 - (long)puVar5;
      if ((long)uVar18 < 0x3fff1) break;
    }
    else {
      iVar2 = *(int *)(literal_buf + uVar18 * 4);
      *(int *)(literal_buf + uVar18 * 4) = iVar11 - iVar24;
      if ((int)*plVar23 == *(int *)(input + iVar2)) {
        puVar5 = input + iVar2;
        goto LAB_00125a05;
      }
    }
    uVar9 = (ulong)((int)uVar9 + 1);
    plVar23 = plVar17;
  } while( true );
  uVar20 = (long)plVar1 + (-4 - (long)plVar23);
  uVar9 = uVar20 & 0xfffffffffffffff8;
  uVar19 = 0;
  lVar13 = 0;
LAB_00125a3b:
  if (uVar20 >> 3 == uVar19) {
    uVar21 = (ulong)((uint)uVar20 & 7);
    puVar22 = (uint8_t *)((long)plVar23 + (4 - lVar13));
    for (; (bVar26 = uVar21 != 0, uVar21 = uVar21 - 1, uVar19 = uVar20, bVar26 &&
           (uVar19 = uVar9, puVar5[uVar9 + 4] == *puVar22)); uVar9 = uVar9 + 1) {
      puVar22 = puVar22 + 1;
    }
  }
  else {
    uVar21 = *(ulong *)((long)plVar23 + uVar19 * 8 + 4);
    if (uVar21 == *(ulong *)(puVar5 + uVar19 * 8 + 4)) goto code_r0x00125a5d;
    uVar21 = *(ulong *)(puVar5 + uVar19 * 8 + 4) ^ uVar21;
    uVar9 = 0;
    if (uVar21 != 0) {
      for (; (uVar21 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
      }
    }
    uVar19 = (uVar9 >> 3 & 0x1fffffff) - lVar13;
  }
  uVar3 = iVar11 - (int)__src_00;
  uVar7 = uVar3;
  if (5 < uVar3) {
    if (uVar3 < 0x82) {
      uVar4 = uVar3 - 2;
      uVar7 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      bVar6 = (char)(uVar7 ^ 0xffffffe0) + 0x1f;
      uVar16 = uVar4 >> (bVar6 & 0x1f);
      uVar7 = (uVar4 - (uVar16 << (bVar6 & 0x1f))) * 0x100 |
              uVar16 + (uVar7 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar3 < 0x842) {
      uVar7 = 0x1f;
      if (uVar3 - 0x42 != 0) {
        for (; uVar3 - 0x42 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = (((-1 << ((byte)uVar7 & 0x1f)) + uVar3 + -0x42) * 0x100 - (uVar7 ^ 0x1f)) + 0x29;
    }
    else {
      iVar11 = uVar3 * 0x100;
      if (uVar3 < 0x1842) {
        uVar7 = iVar11 - 0x841eb;
      }
      else if (uVar3 < 0x5842) {
        uVar7 = iVar11 - 0x1841ea;
      }
      else {
        uVar7 = iVar11 - 0x5841e9;
      }
    }
  }
  *puVar25 = uVar7;
  memcpy(local_90,__src_00,(long)(int)uVar3);
  uVar7 = 0x40;
  if (iVar12 != (int)uVar18) {
    uVar4 = (int)uVar18 + 3;
    uVar7 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    bVar6 = 0x1e - (char)(uVar7 ^ 0x1f);
    bVar26 = (uVar4 >> (bVar6 & 0x1f) & 1) != 0;
    uVar7 = (uint)bVar26 +
            ((uVar4 - (bVar26 + 2 << (bVar6 & 0x1f))) * 0x100 | (uVar7 ^ 0x1f) * 2 ^ 0x3e) + 0x4c;
    uVar14 = uVar18 & 0xffffffff;
  }
  uVar9 = uVar19 + 4;
  puVar25[1] = uVar7;
  if (uVar9 < 0xc) {
    uVar7 = (int)uVar9 + 0x14;
  }
  else {
    if (0x47 < uVar9) {
      if (uVar9 < 0x88) {
        puVar25[2] = ((uint)(uVar19 - 4) & 0x1f) << 8 | (int)(uVar19 - 4 >> 5) + 0x36U;
        puVar25[3] = 0x40;
        lStackY_a0 = 0x10;
      }
      else {
        if (uVar9 < 0x848) {
          uVar7 = (int)uVar19 - 0x44;
          iVar12 = 0x1f;
          if (uVar7 != 0) {
            for (; uVar7 >> iVar12 == 0; iVar12 = iVar12 + -1) {
            }
          }
          puVar25[2] = ((int)(-1L << ((byte)iVar12 & 0x3f)) + (int)uVar19 + -0x44) * 0x100 + iVar12
                       + 0x34;
        }
        else {
          puVar25[2] = (int)uVar9 * 0x100 - 0x847c1;
        }
        puVar25[3] = 0x40;
        lStackY_a0 = 0x10;
      }
      goto LAB_00125bba;
    }
    uVar7 = 0x1f;
    uVar4 = (uint)(uVar19 - 4);
    if (uVar4 != 0) {
      for (; uVar4 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    bVar6 = (char)(uVar7 ^ 0xffffffe0) + 0x1f;
    iVar12 = (int)(uVar19 - 4 >> (bVar6 & 0x3f));
    uVar7 = (uVar4 - (iVar12 << (bVar6 & 0x1f))) * 0x100 | iVar12 + (uVar7 ^ 0xffffffe0) * 2 + 0x5a;
  }
  puVar25[2] = uVar7;
  lStackY_a0 = 0xc;
LAB_00125bba:
  __src = (long *)((long)plVar23 + uVar19 + 4);
  local_90 = (uint32_t *)((long)local_90 + (long)(int)uVar3);
  puVar25 = (uint32_t *)((long)puVar25 + lStackY_a0);
  if (plVar8 <= __src) goto LAB_00125ed7;
  uVar9 = *(ulong *)((long)plVar23 + uVar19 + 1);
  iVar12 = (int)__src - iVar24;
  *(int *)(literal_buf + ((uVar9 & 0xffffffff00) * 0x1e35a7bd000000 >> 0x33) * 4) = iVar12 + -2;
  *(int *)(literal_buf + (uVar9 * 0x1e35a7bd00000000 >> 0x33) * 4) = iVar12 + -1;
  __src_00 = __src;
  while( true ) {
    uVar9 = (uVar9 & 0xffffffff000000) * 0x1e35a7bd00 >> 0x33;
    iVar11 = *(int *)(literal_buf + uVar9 * 4);
    *(int *)(literal_buf + uVar9 * 4) = iVar12;
    piVar10 = (int *)(input + iVar11);
    uVar18 = (long)__src_00 - (long)piVar10;
    if ((0x3fff0 < (long)uVar18) || ((int)*__src_00 != *piVar10)) break;
    uVar14 = (long)plVar1 + (-4 - (long)__src_00);
    uVar9 = uVar14 & 0xfffffffffffffff8;
    uVar19 = 0;
    lVar13 = 0;
LAB_00125c7a:
    if (uVar14 >> 3 == uVar19) {
      uVar20 = (ulong)((uint)uVar14 & 7);
      pcVar15 = (char *)((long)__src_00 + (4 - lVar13));
      for (; (bVar26 = uVar20 != 0, uVar20 = uVar20 - 1, uVar19 = uVar14, bVar26 &&
             (uVar19 = uVar9, *(char *)((long)piVar10 + uVar9 + 4) == *pcVar15)); uVar9 = uVar9 + 1)
      {
        pcVar15 = pcVar15 + 1;
      }
    }
    else {
      uVar20 = *(ulong *)((long)__src_00 + uVar19 * 8 + 4);
      if (uVar20 == *(ulong *)(piVar10 + uVar19 * 2 + 1)) goto code_r0x00125c90;
      uVar20 = *(ulong *)(piVar10 + uVar19 * 2 + 1) ^ uVar20;
      uVar14 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
        }
      }
      uVar19 = (uVar14 >> 3 & 0x1fffffff) - lVar13;
    }
    uVar14 = uVar19 + 4;
    if (uVar14 < 10) {
      uVar7 = (int)uVar14 + 0x26;
    }
    else if (uVar14 < 0x86) {
      uVar7 = 0x1f;
      uVar3 = (uint)(uVar19 - 2);
      if (uVar3 != 0) {
        for (; uVar3 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      bVar6 = (char)(uVar7 ^ 0xffffffe0) + 0x1f;
      iVar12 = (int)(uVar19 - 2 >> (bVar6 & 0x3f));
      uVar7 = (uVar3 - (iVar12 << (bVar6 & 0x1f))) * 0x100 |
              iVar12 + (uVar7 ^ 0xffffffe0) * 2 + 0x6a;
    }
    else if (uVar14 < 0x846) {
      uVar7 = (int)uVar19 - 0x42;
      iVar12 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar12 == 0; iVar12 = iVar12 + -1) {
        }
      }
      uVar7 = ((int)(-1L << ((byte)iVar12 & 0x3f)) + (int)uVar19 + -0x42) * 0x100 + iVar12 + 0x34;
    }
    else {
      uVar7 = (int)uVar14 * 0x100 - 0x845c1;
    }
    __src = (long *)((long)__src_00 + uVar19 + 4);
    *puVar25 = uVar7;
    uVar3 = (int)uVar18 + 3;
    uVar7 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    bVar6 = 0x1e - (char)(uVar7 ^ 0x1f);
    bVar26 = (uVar3 >> (bVar6 & 0x1f) & 1) != 0;
    puVar25[1] = (uint)bVar26 +
                 ((uVar3 - (bVar26 + 2 << (bVar6 & 0x1f))) * 0x100 | (uVar7 ^ 0x1f) * 2 ^ 0x3e) +
                 0x4c;
    puVar25 = puVar25 + 2;
    if (plVar8 <= __src) goto LAB_00125ed7;
    uVar9 = *(ulong *)((long)__src_00 + uVar19 + 1);
    iVar12 = (int)__src - iVar24;
    *(int *)(literal_buf + (uVar9 * 0x1e35a7bd00000000 >> 0x33) * 4) = iVar12 + -3;
    *(int *)(literal_buf + ((uVar9 & 0xffffffff00) * 0x1e35a7bd000000 >> 0x33) * 4) = iVar12 + -2;
    *(int *)(literal_buf + ((uVar9 & 0xffffffff0000) * 0x1e35a7bd0000 >> 0x33) * 4) = iVar12 + -1;
    uVar14 = uVar18 & 0xffffffff;
    __src_00 = __src;
  }
  goto LAB_00125997;
code_r0x00125a5d:
  lVar13 = lVar13 + -8;
  uVar19 = uVar19 + 1;
  goto LAB_00125a3b;
code_r0x00125c90:
  lVar13 = lVar13 + -8;
  uVar19 = uVar19 + 1;
  goto LAB_00125c7a;
}

Assistant:

void BrotliCompressFragmentTwoPass(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          m, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    RewindBitPosition(initial_storage_ix, storage_ix, storage);
    EmitUncompressedMetaBlock(input, input_size, storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}